

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash_table.h
# Opt level: O0

void * alias_table_internal_table_get_cell(alias_table_internal_table *table,void *key)

{
  uint uVar1;
  Alias alias;
  Alias alias_00;
  Alias alias_01;
  uint32_t hash_00;
  int iVar2;
  alias_table_internal_table_cell paVar3;
  alias_table_internal_table_cell hopCell;
  int hop;
  uint32_t jump;
  alias_table_internal_table_cell cell;
  uint32_t hash;
  void *key_local;
  alias_table_internal_table *table_local;
  
  hash_00 = string_hash((char *)key);
  paVar3 = alias_table_internal_table_lookup(table,hash_00);
  alias.name = (paVar3->value).name;
  alias.class = (paVar3->value).class;
  iVar2 = alias_is_null(alias);
  if (iVar2 == 0) {
    alias_00.name = (paVar3->value).name;
    alias_00.class = (paVar3->value).class;
    iVar2 = alias_compare((char *)key,alias_00);
    if (iVar2 != 0) {
      return paVar3;
    }
    iVar2 = 0;
    hopCell._4_4_ = paVar3->secondMaps;
    for (uVar1 = hopCell._4_4_; (uVar1 & 1) == 0; uVar1 = uVar1 >> 1 | 0x80000000) {
      iVar2 = iVar2 + 1;
    }
    hopCell._0_4_ = iVar2 + 1;
    if (hopCell._4_4_ == 0) {
      hopCell._0_4_ = 0;
    }
    while (0 < (int)hopCell) {
      paVar3 = alias_table_internal_table_lookup(table,hash_00 + (int)hopCell);
      alias_01.name = (paVar3->value).name;
      alias_01.class = (paVar3->value).class;
      iVar2 = alias_compare((char *)key,alias_01);
      if (iVar2 != 0) {
        return paVar3;
      }
      iVar2 = 0;
      hopCell._4_4_ = (1 << ((char)(int)hopCell - 1U & 0x1f) ^ 0xffffffffU) & hopCell._4_4_;
      for (uVar1 = hopCell._4_4_; (uVar1 & 1) == 0; uVar1 = uVar1 >> 1 | 0x80000000) {
        iVar2 = iVar2 + 1;
      }
      hopCell._0_4_ = iVar2 + 1;
      if (hopCell._4_4_ == 0) {
        hopCell._0_4_ = 0;
      }
    }
  }
  if (table->old == (alias_table_internal_table_struct *)0x0) {
    table_local = (alias_table_internal_table *)0x0;
  }
  else {
    table_local = (alias_table_internal_table *)alias_table_internal_table_get_cell(table->old,key);
  }
  return table_local;
}

Assistant:

static void *PREFIX(_table_get_cell)(PREFIX(_table) *table, const void *key)
{
	uint32_t hash = MAP_TABLE_HASH_KEY(key);
	PREFIX(_table_cell) cell = PREFIX(_table_lookup)(table, hash);
	// Value does not exist.
	if (!MAP_TABLE_VALUE_NULL(cell->value))
	{
		if (MAP_TABLE_COMPARE_FUNCTION(key, cell->value))
		{
			return cell;
		}
		uint32_t jump = cell->secondMaps;
		// Look at each offset defined by the jump table to find the displaced location.
		for (int hop = __builtin_ffs(jump) ; hop > 0 ; hop = __builtin_ffs(jump))
		{
			PREFIX(_table_cell) hopCell = PREFIX(_table_lookup)(table, hash+hop);
			if (MAP_TABLE_COMPARE_FUNCTION(key, hopCell->value))
			{
				return hopCell;
			}
			// Clear the most significant bit and try again.
			jump &= ~(1 << (hop-1));
		}
	}
#ifndef MAP_TABLE_STATIC_SIZE
	if (table->old)
	{
		return PREFIX(_table_get_cell)(table->old, key);
	}
#endif
	return NULL;
}